

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

bool __thiscall
re2::DFA::Search(DFA *this,StringPiece *text,StringPiece *context,bool anchored,
                bool want_earliest_match,bool run_forward,bool *failed,char **epp,
                vector<int,_std::allocator<int>_> *matches)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  RWLocker local_98;
  SearchParams local_88;
  
  *epp = (char *)0x0;
  if (this->init_failed_ == true) {
    *failed = true;
    return false;
  }
  *failed = false;
  local_98.mu_ = &this->cache_mutex_;
  local_98.writing_ = false;
  iVar2 = pthread_rwlock_rdlock((pthread_rwlock_t *)local_98.mu_);
  if (iVar2 != 0) {
    abort();
  }
  local_88.text.ptr_ = text->ptr_;
  local_88.text.length_ = text->length_;
  local_88.text._12_4_ = *(undefined4 *)&text->field_0xc;
  local_88.context.ptr_ = context->ptr_;
  local_88.context.length_ = context->length_;
  local_88.context._12_4_ = *(undefined4 *)&context->field_0xc;
  local_88.start = (State *)0x0;
  local_88.firstbyte = -1;
  local_88.failed = false;
  local_88.ep = (char *)0x0;
  local_88.matches = matches;
  local_88.anchored = anchored;
  local_88.want_earliest_match = want_earliest_match;
  local_88.run_forward = run_forward;
  local_88.cache_lock = &local_98;
  bVar1 = AnalyzeSearch(this,&local_88);
  if (bVar1) {
    if (local_88.start != (State *)0x1) {
      if (local_88.start == (State *)0x2) {
        lVar3 = 0;
        if (want_earliest_match != run_forward) {
          lVar3 = (long)text->length_;
        }
        *epp = text->ptr_ + lVar3;
        bVar1 = true;
        goto LAB_001302e1;
      }
      bVar1 = FastSearchLoop(this,&local_88);
      if (local_88.failed != true) {
        *epp = local_88.ep;
        goto LAB_001302e1;
      }
      goto LAB_001302dc;
    }
  }
  else {
LAB_001302dc:
    *failed = true;
  }
  bVar1 = false;
LAB_001302e1:
  RWLocker::~RWLocker(&local_98);
  return bVar1;
}

Assistant:

bool DFA::Search(const StringPiece& text,
                 const StringPiece& context,
                 bool anchored,
                 bool want_earliest_match,
                 bool run_forward,
                 bool* failed,
                 const char** epp,
                 vector<int>* matches) {
  *epp = NULL;
  if (!ok()) {
    *failed = true;
    return false;
  }
  *failed = false;

  if (DebugDFA) {
    fprintf(stderr, "\nprogram:\n%s\n", prog_->DumpUnanchored().c_str());
    fprintf(stderr, "text %s anchored=%d earliest=%d fwd=%d kind %d\n",
            text.as_string().c_str(), anchored, want_earliest_match,
            run_forward, kind_);
  }

  RWLocker l(&cache_mutex_);
  SearchParams params(text, context, &l);
  params.anchored = anchored;
  params.want_earliest_match = want_earliest_match;
  params.run_forward = run_forward;
  params.matches = matches;

  if (!AnalyzeSearch(&params)) {
    *failed = true;
    return false;
  }
  if (params.start == DeadState)
    return false;
  if (params.start == FullMatchState) {
    if (run_forward == want_earliest_match)
      *epp = text.begin();
    else
      *epp = text.end();
    return true;
  }
  if (DebugDFA)
    fprintf(stderr, "start %s\n", DumpState(params.start).c_str());
  bool ret = FastSearchLoop(&params);
  if (params.failed) {
    *failed = true;
    return false;
  }
  *epp = params.ep;
  return ret;
}